

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall InterpreterTest_CeilF32_Test::TestBody(InterpreterTest_CeilF32_Test *this)

{
  allocator<wasm::Literal> *this_00;
  Literal LVar1;
  initializer_list<wasm::Literal> __l;
  bool bVar2;
  Err *pEVar3;
  char *pcVar4;
  char *in_R9;
  undefined8 in_stack_fffffffffffff888;
  undefined8 in_stack_fffffffffffff890;
  Type in_stack_fffffffffffff898;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_728;
  AssertHelper local_6d8;
  Message local_6d0;
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar;
  anon_union_16_6_1532cd5a_for_Literal_0 local_6a8;
  anon_union_16_6_1532cd5a_for_Literal_0 local_690;
  undefined1 local_680 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> expected;
  undefined1 local_638 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> results;
  AssertHelper local_600;
  Message local_5f8;
  bool local_5e9;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar__2;
  Result<wasm::Expression_*> expr;
  string local_5b0;
  AssertHelper local_590;
  Message local_588;
  Result<wasm::Ok> local_580 [47];
  bool local_551;
  undefined1 local_550 [8];
  AssertionResult gtest_ar__1;
  string local_538;
  AssertHelper local_518;
  Message local_510;
  Literal local_508;
  Result<wasm::Ok> local_4f0 [47];
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_4a0 [8];
  IRBuilder builder;
  Module wasm;
  InterpreterTest_CeilF32_Test *this_local;
  
  ::wasm::Module::Module((Module *)&builder.blockHint);
  ::wasm::IRBuilder::IRBuilder((IRBuilder *)local_4a0,(Module *)&builder.blockHint);
  ::wasm::Literal::Literal(&local_508,1.5);
  LVar1.field_0.func.super_IString.str._M_str = (char *)in_stack_fffffffffffff890;
  LVar1.field_0.i64 = in_stack_fffffffffffff888;
  LVar1.type.id = in_stack_fffffffffffff898.id;
  ::wasm::IRBuilder::makeConst(LVar1);
  pEVar3 = ::wasm::Result<wasm::Ok>::getErr(local_4f0);
  local_4c1 = pEVar3 == (Err *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c0,&local_4c1,(type *)0x0);
  ::wasm::Result<wasm::Ok>::~Result(local_4f0);
  ::wasm::Literal::~Literal(&local_508);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar2) {
    testing::Message::Message(&local_510);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_538,(internal *)local_4c0,
               (AssertionResult *)"builder.makeConst(Literal(float(1.5))).getErr()","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
               ,0x2b3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_518,&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    std::__cxx11::string::~string((string *)&local_538);
    testing::Message::~Message(&local_510);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    ::wasm::IRBuilder::makeUnary((UnaryOp)local_580);
    pEVar3 = ::wasm::Result<wasm::Ok>::getErr(local_580);
    local_551 = pEVar3 == (Err *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_550,&local_551,(type *)0x0);
    ::wasm::Result<wasm::Ok>::~Result(local_580);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
    if (!bVar2) {
      testing::Message::Message(&local_588);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_5b0,(internal *)local_550,
                 (AssertionResult *)"builder.makeUnary(CeilFloat32).getErr()","true","false",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_590,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                 ,0x2b4,pcVar4);
      testing::internal::AssertHelper::operator=(&local_590,&local_588);
      testing::internal::AssertHelper::~AssertHelper(&local_590);
      std::__cxx11::string::~string((string *)&local_5b0);
      testing::Message::~Message(&local_588);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      ::wasm::IRBuilder::build();
      pEVar3 = ::wasm::Result<wasm::Expression_*>::getErr
                         ((Result<wasm::Expression_*> *)&gtest_ar__2.message_);
      local_5e9 = pEVar3 == (Err *)0x0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_5e8,&local_5e9,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
      if (!bVar2) {
        testing::Message::Message(&local_5f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_5e8,
                   (AssertionResult *)"expr.getErr()","true","false",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_600,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                   ,0x2b7,pcVar4);
        testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
        testing::internal::AssertHelper::~AssertHelper(&local_600);
        std::__cxx11::string::~string
                  ((string *)
                   &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_5f8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::wasm::Interpreter::Interpreter
                  ((Interpreter *)
                   &expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        ::wasm::Result<wasm::Expression_*>::operator*
                  ((Result<wasm::Expression_*> *)&gtest_ar__2.message_);
        ::wasm::Interpreter::runTest((Expression *)local_638);
        ::wasm::Interpreter::~Interpreter
                  ((Interpreter *)
                   &expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        ::wasm::Literal::Literal((Literal *)&local_6a8.func,2.0);
        local_690.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_6a8;
        local_690.func.super_IString.str._M_str = (char *)0x1;
        this_00 = (allocator<wasm::Literal> *)
                  ((long)&gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  + 7);
        std::allocator<wasm::Literal>::allocator(this_00);
        __l._M_len = (size_type)local_690.func.super_IString.str._M_str;
        __l._M_array = (iterator)local_690.i64;
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_680,__l,this_00);
        std::allocator<wasm::Literal>::~allocator
                  ((allocator<wasm::Literal> *)
                   ((long)&gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 7));
        local_728 = &local_690;
        do {
          local_728 = (anon_union_16_6_1532cd5a_for_Literal_0 *)((long)local_728 + -0x18);
          ::wasm::Literal::~Literal((Literal *)&local_728->func);
        } while (local_728 != &local_6a8);
        testing::internal::EqHelper::
        Compare<std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>,_nullptr>
                  ((EqHelper *)local_6c8,"results","expected",
                   (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_638,
                   (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_680);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c8);
        if (!bVar2) {
          testing::Message::Message(&local_6d0);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6c8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_6d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                     ,700,pcVar4);
          testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
          testing::internal::AssertHelper::~AssertHelper(&local_6d8);
          testing::Message::~Message(&local_6d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c8);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_680);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_638);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
      ::wasm::Result<wasm::Expression_*>::~Result
                ((Result<wasm::Expression_*> *)&gtest_ar__2.message_);
    }
  }
  ::wasm::IRBuilder::~IRBuilder((IRBuilder *)local_4a0);
  ::wasm::Module::~Module((Module *)&builder.blockHint);
  return;
}

Assistant:

TEST(InterpreterTest, CeilF32) {
  Module wasm;
  IRBuilder builder(wasm);

  ASSERT_FALSE(builder.makeConst(Literal(float(1.5))).getErr());
  ASSERT_FALSE(builder.makeUnary(CeilFloat32).getErr());

  auto expr = builder.build();
  ASSERT_FALSE(expr.getErr());

  auto results = Interpreter{}.runTest(*expr);
  std::vector<Literal> expected{Literal(float(2.0))};

  EXPECT_EQ(results, expected);
}